

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_basic.c
# Opt level: O1

void test_basic(void)

{
  wchar_t wVar1;
  FILE *__s;
  size_t sVar2;
  char *pcVar3;
  char *pcVar4;
  char result [1024];
  char local_438 [1032];
  
  assertion_umask("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/cpio/test/test_basic.c"
                  ,L'u',L'\0');
  __s = fopen("filelist","w");
  memset(local_438,0,0x400);
  assertion_make_file("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/cpio/test/test_basic.c"
                      ,L'~',"file",L'Ƥ',L'\xffffffff',"1234567890");
  fwrite("file\n",5,1,__s);
  wVar1 = is_LargeInode("file");
  if (wVar1 != L'\0') {
    sVar2 = strlen(local_438);
    strncat(local_438,"bsdcpio: file: large inode number truncated: ",0x3ff - sVar2);
    pcVar3 = strerror(0x22);
    sVar2 = strlen(local_438);
    strncat(local_438,pcVar3,0x3ff - sVar2);
    sVar2 = strlen(local_438);
    strncat(local_438,"\n",0x3ff - sVar2);
  }
  assertion_make_hardlink
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/cpio/test/test_basic.c"
             ,L'\x8d',"linkfile","file");
  fwrite("linkfile\n",9,1,__s);
  wVar1 = is_LargeInode("linkfile");
  if (wVar1 != L'\0') {
    sVar2 = strlen(local_438);
    strncat(local_438,"bsdcpio: linkfile: large inode number truncated: ",0x3ff - sVar2);
    pcVar3 = strerror(0x22);
    sVar2 = strlen(local_438);
    strncat(local_438,pcVar3,0x3ff - sVar2);
    sVar2 = strlen(local_438);
    strncat(local_438,"\n",0x3ff - sVar2);
  }
  wVar1 = canSymlink();
  if (wVar1 != L'\0') {
    assertion_make_symlink
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/cpio/test/test_basic.c"
               ,L'\x9d',"symlink","file",L'\0');
    fwrite("symlink\n",8,1,__s);
    wVar1 = is_LargeInode("symlink");
    if (wVar1 != L'\0') {
      sVar2 = strlen(local_438);
      strncat(local_438,"bsdcpio: symlink: large inode number truncated: ",0x3ff - sVar2);
      pcVar3 = strerror(0x22);
      sVar2 = strlen(local_438);
      strncat(local_438,pcVar3,0x3ff - sVar2);
      sVar2 = strlen(local_438);
      strncat(local_438,"\n",0x3ff - sVar2);
    }
  }
  pcVar3 = (char *)0xffffffff;
  assertion_make_file("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/cpio/test/test_basic.c"
                      ,L'­',"file2",L'ǿ',L'\xffffffff',"1234567890");
  fwrite("file2\n",6,1,__s);
  wVar1 = is_LargeInode("file2");
  if (wVar1 != L'\0') {
    sVar2 = strlen(local_438);
    strncat(local_438,"bsdcpio: file2: large inode number truncated: ",0x3ff - sVar2);
    pcVar4 = strerror(0x22);
    sVar2 = strlen(local_438);
    strncat(local_438,pcVar4,0x3ff - sVar2);
    sVar2 = strlen(local_438);
    strncat(local_438,"\n",0x3ff - sVar2);
  }
  assertion_make_dir("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/cpio/test/test_basic.c"
                     ,L'¼',"dir",L'ǽ');
  fwrite("dir\n",4,1,__s);
  wVar1 = is_LargeInode("dir");
  if (wVar1 != L'\0') {
    sVar2 = strlen(local_438);
    strncat(local_438,"bsdcpio: dir: large inode number truncated: ",0x3ff - sVar2);
    pcVar4 = strerror(0x22);
    sVar2 = strlen(local_438);
    strncat(local_438,pcVar4,0x3ff - sVar2);
    sVar2 = strlen(local_438);
    strncat(local_438,"\n",0x3ff - sVar2);
  }
  sVar2 = strlen(local_438);
  strncat(local_438,"2 blocks\n",0x3ff - sVar2);
  fclose(__s);
  assertion_umask("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/cpio/test/test_basic.c"
                  ,L'Î',L'\x12');
  wVar1 = canSymlink();
  pcVar4 = "2 blocks\n";
  if (wVar1 == L'\0') {
    pcVar4 = "1 block\n";
  }
  basic_cpio("copy","",pcVar4,pcVar4,pcVar3);
  basic_cpio("copy_odc","--format=odc",pcVar4,pcVar4,pcVar3);
  basic_cpio("copy_newc","-H newc",local_438,"2 blocks\n",pcVar3);
  basic_cpio("copy_cpio","-H odc",pcVar4,pcVar4,pcVar3);
  basic_cpio("copy_bin","-H bin","1 block\n","1 block\n",pcVar3);
  wVar1 = canSymlink();
  pcVar4 = "9 blocks\n";
  if (wVar1 == L'\0') {
    pcVar4 = "8 blocks\n";
  }
  basic_cpio("copy_ustar","-H ustar",pcVar4,pcVar4,pcVar3);
  wVar1 = assertion_make_dir("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/cpio/test/test_basic.c"
                             ,L'Y',"passthrough",L'ǽ');
  if (wVar1 != L'\0') {
    wVar1 = systemf("%s -p %s <filelist >%s/stdout 2>%s/stderr",testprog,"passthrough","passthrough"
                   );
    failure("Error invoking %s -p",testprog);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/cpio/test/test_basic.c"
                        ,L'b',(long)wVar1,"r",0,"0",(void *)0x0);
    assertion_chdir("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/cpio/test/test_basic.c"
                    ,L'd',"passthrough");
    failure("Error invoking %s -p in dir %s",testprog,"passthrough");
    assertion_text_file_contents
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/cpio/test/test_basic.c"
               ,L'i',"1 block\n","stderr");
    verify_files("passthrough");
    assertion_chdir("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/cpio/test/test_basic.c"
                    ,L'l',"..");
  }
  return;
}

Assistant:

DEFINE_TEST(test_basic)
{
	FILE *filelist;
	const char *msg;
	char result[1024];

	assertUmask(0);

	/*
	 * Create an assortment of files on disk.
	 */
	filelist = fopen("filelist", "w");
	memset(result, 0, sizeof(result));

	/* File with 10 bytes content. */
	assertMakeFile("file", 0644, "1234567890");
	fprintf(filelist, "file\n");
	if (is_LargeInode("file")) {
		strncat(result,
		    "bsdcpio: file: large inode number truncated: ",
		    sizeof(result) - strlen(result) -1);
		strncat(result,
		    strerror(ERANGE),
		    sizeof(result) - strlen(result) -1);
		strncat(result,
		    "\n",
		    sizeof(result) - strlen(result) -1);
	}

	/* hardlink to above file. */
	assertMakeHardlink("linkfile", "file");
	fprintf(filelist, "linkfile\n");
	if (is_LargeInode("linkfile")) {
		strncat(result,
		    "bsdcpio: linkfile: large inode number truncated: ",
		    sizeof(result) - strlen(result) -1);
		strncat(result,
		    strerror(ERANGE),
		    sizeof(result) - strlen(result) -1);
		strncat(result,
		    "\n",
		    sizeof(result) - strlen(result) -1);
	}

	/* Symlink to above file. */
	if (canSymlink()) {
		assertMakeSymlink("symlink", "file", 0);
		fprintf(filelist, "symlink\n");
		if (is_LargeInode("symlink")) {
			strncat(result,
			    "bsdcpio: symlink: large inode number truncated: ",
			    sizeof(result) - strlen(result) -1);
			strncat(result,
			    strerror(ERANGE),
			    sizeof(result) - strlen(result) -1);
			strncat(result,
			    "\n",
			    sizeof(result) - strlen(result) -1);
		}
	}

	/* Another file with different permissions. */
	assertMakeFile("file2", 0777, "1234567890");
	fprintf(filelist, "file2\n");
	if (is_LargeInode("file2")) {
		strncat(result,
		    "bsdcpio: file2: large inode number truncated: ",
		    sizeof(result) - strlen(result) -1);
		strncat(result,
		    strerror(ERANGE),
		    sizeof(result) - strlen(result) -1);
		strncat(result,
		    "\n",
		    sizeof(result) - strlen(result) -1);
	}

	/* Directory. */
	assertMakeDir("dir", 0775);
	fprintf(filelist, "dir\n");
	if (is_LargeInode("dir")) {
		strncat(result,
		    "bsdcpio: dir: large inode number truncated: ",
		    sizeof(result) - strlen(result) -1);
		strncat(result,
		    strerror(ERANGE),
		    sizeof(result) - strlen(result) -1);
		strncat(result,
		    "\n",
		    sizeof(result) - strlen(result) -1);
	}
	strncat(result, "2 blocks\n", sizeof(result) - strlen(result) -1);

	/* All done. */
	fclose(filelist);

	assertUmask(022);

	/* Archive/dearchive with a variety of options. */
	msg = canSymlink() ? "2 blocks\n" : "1 block\n";
	basic_cpio("copy", "", "", msg, msg);
	basic_cpio("copy_odc", "--format=odc", "", msg, msg);
	basic_cpio("copy_newc", "-H newc", "", result, "2 blocks\n");
	basic_cpio("copy_cpio", "-H odc", "", msg, msg);
	msg = "1 block\n";
	basic_cpio("copy_bin", "-H bin", "", msg, msg);
	msg = canSymlink() ? "9 blocks\n" : "8 blocks\n";
	basic_cpio("copy_ustar", "-H ustar", "", msg, msg);

	/* Copy in one step using -p */
	passthrough("passthrough");
}